

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFData_test.cpp
# Opt level: O3

void __thiscall PFData_test_fileFromData_Test::TestBody(PFData_test_fileFromData_Test *this)

{
  undefined8 *puVar1;
  size_type sVar2;
  int iVar3;
  int i;
  long lVar4;
  pointer *__ptr;
  char *pcVar5;
  int retval;
  int p;
  int q;
  int r;
  PFData test_read;
  PFData test;
  double data [24];
  AssertHelper local_298;
  AssertHelper local_290;
  Message local_288;
  undefined8 *local_280;
  int local_278;
  int local_274;
  int local_270;
  int local_26c;
  PFData local_268;
  string local_1c0;
  string local_1a0;
  PFData local_180;
  double local_d8 [25];
  
  local_278 = -1;
  lVar4 = 0;
  do {
    iVar3 = rand();
    local_d8[lVar4] = (double)iVar3 / 1000.0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x18);
  PFData::PFData(&local_180,local_d8,1,4,6);
  local_26c = PFData::getR(&local_180);
  local_288.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_268,"1","r",(int *)&local_288,&local_26c);
  if ((char)local_268.m_filename._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_288);
    if ((undefined8 *)local_268.m_filename._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_268.m_filename._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x26b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_298,&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_298);
    if ((long *)CONCAT44(local_288.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_288.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_288.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_288.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  sVar2 = local_268.m_filename._M_string_length;
  if ((undefined8 *)local_268.m_filename._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_268.m_filename._M_string_length !=
        (undefined8 *)(local_268.m_filename._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_268.m_filename._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  local_270 = PFData::getQ(&local_180);
  local_288.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_268,"1","q",(int *)&local_288,&local_270);
  if ((char)local_268.m_filename._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_288);
    if ((undefined8 *)local_268.m_filename._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_268.m_filename._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x26d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_298,&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_298);
    if ((long *)CONCAT44(local_288.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_288.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_288.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_288.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  sVar2 = local_268.m_filename._M_string_length;
  if ((undefined8 *)local_268.m_filename._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_268.m_filename._M_string_length !=
        (undefined8 *)(local_268.m_filename._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_268.m_filename._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  local_274 = PFData::getP(&local_180);
  local_288.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_268,"1","p",(int *)&local_288,&local_274);
  if ((char)local_268.m_filename._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_288);
    if ((undefined8 *)local_268.m_filename._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_268.m_filename._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x26f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_298,&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_298);
    if ((long *)CONCAT44(local_288.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_288.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_288.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_288.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  if ((undefined8 *)local_268.m_filename._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_268.m_filename._M_string_length !=
        (undefined8 *)(local_268.m_filename._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_268.m_filename._M_string_length);
    }
    operator_delete((void *)local_268.m_filename._M_string_length);
  }
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a0,"tests/pfb_file_from_data.pfb","");
  local_278 = PFData::writeFile(&local_180,&local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c0,"tests/pfb_file_from_data.pfb","");
  PFData::PFData(&local_268,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  local_278 = PFData::loadHeader(&local_268);
  local_298.data_ = (AssertHelperData *)((ulong)local_298.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_288,"0","retval",(int *)&local_298,&local_278);
  if (local_288.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_298);
    if (local_280 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_280;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x274,pcVar5);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    if (local_298.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_298.data_ + 8))();
    }
  }
  puVar1 = local_280;
  if (local_280 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_280 != local_280 + 2) {
      operator_delete((undefined8 *)*local_280);
    }
    operator_delete(puVar1);
  }
  local_278 = PFData::loadData(&local_268);
  local_298.data_ = local_298.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_288,"0","retval",(int *)&local_298,&local_278);
  if (local_288.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_298);
    if (local_280 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_280;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x276,pcVar5);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    if (local_298.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_298.data_ + 8))();
    }
  }
  puVar1 = local_280;
  if (local_280 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_280 != local_280 + 2) {
      operator_delete((undefined8 *)*local_280);
    }
    operator_delete(puVar1);
  }
  local_26c = PFData::getR(&local_268);
  local_298.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_288,"1","r",(int *)&local_298,&local_26c);
  if (local_288.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_298);
    if (local_280 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_280;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x278,pcVar5);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    if (local_298.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_298.data_ + 8))();
    }
  }
  puVar1 = local_280;
  if (local_280 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_280 != local_280 + 2) {
      operator_delete((undefined8 *)*local_280);
    }
    operator_delete(puVar1);
  }
  local_270 = PFData::getQ(&local_268);
  local_298.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_288,"1","q",(int *)&local_298,&local_270);
  if (local_288.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_298);
    if (local_280 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_280;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x27a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    if (local_298.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_298.data_ + 8))();
    }
  }
  puVar1 = local_280;
  if (local_280 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_280 != local_280 + 2) {
      operator_delete((undefined8 *)*local_280);
    }
    operator_delete(puVar1);
  }
  local_274 = PFData::getP(&local_268);
  local_298.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_288,"1","p",(int *)&local_298,&local_274);
  if (local_288.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_298);
    if (local_280 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_280;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x27c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    if (local_298.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_298.data_ + 8))();
    }
  }
  puVar1 = local_280;
  if (local_280 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_280 != local_280 + 2) {
      operator_delete((undefined8 *)*local_280);
    }
    operator_delete(puVar1);
  }
  local_290.data_._0_4_ = 1;
  local_298.data_ = (AssertHelperData *)PFData::getDZ(&local_268);
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&local_288,"1","test_read.getDZ()",(int *)&local_290,(double *)&local_298);
  if (local_288.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_298);
    if (local_280 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_280;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x27d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    if (local_298.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_298.data_ + 8))();
    }
  }
  puVar1 = local_280;
  if (local_280 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_280 != local_280 + 2) {
      operator_delete((undefined8 *)*local_280);
    }
    operator_delete(puVar1);
  }
  local_290.data_._0_4_ = 1;
  local_298.data_ = (AssertHelperData *)PFData::getDY(&local_268);
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&local_288,"1","test_read.getDY()",(int *)&local_290,(double *)&local_298);
  if (local_288.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_298);
    if (local_280 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_280;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x27e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    if (local_298.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_298.data_ + 8))();
    }
  }
  puVar1 = local_280;
  if (local_280 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_280 != local_280 + 2) {
      operator_delete((undefined8 *)*local_280);
    }
    operator_delete(puVar1);
  }
  local_290.data_._0_4_ = 1;
  local_298.data_ = (AssertHelperData *)PFData::getDX(&local_268);
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&local_288,"1","test_read.getDX()",(int *)&local_290,(double *)&local_298);
  if (local_288.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_298);
    if (local_280 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_280;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x27f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    if (local_298.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_298.data_ + 8))();
    }
  }
  puVar1 = local_280;
  if (local_280 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_280 != local_280 + 2) {
      operator_delete((undefined8 *)*local_280);
    }
    operator_delete(puVar1);
  }
  local_298.data_._0_4_ = 1;
  local_290.data_._0_4_ = PFData::getNZ(&local_268);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_288,"1","test_read.getNZ()",(int *)&local_298,(int *)&local_290);
  if (local_288.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_298);
    if (local_280 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_280;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x280,pcVar5);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    if (local_298.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_298.data_ + 8))();
    }
  }
  puVar1 = local_280;
  if (local_280 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_280 != local_280 + 2) {
      operator_delete((undefined8 *)*local_280);
    }
    operator_delete(puVar1);
  }
  local_298.data_._0_4_ = 4;
  local_290.data_._0_4_ = PFData::getNY(&local_268);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_288,"4","test_read.getNY()",(int *)&local_298,(int *)&local_290);
  if (local_288.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_298);
    if (local_280 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_280;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x281,pcVar5);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    if (local_298.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_298.data_ + 8))();
    }
  }
  puVar1 = local_280;
  if (local_280 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_280 != local_280 + 2) {
      operator_delete((undefined8 *)*local_280);
    }
    operator_delete(puVar1);
  }
  local_298.data_._0_4_ = 6;
  local_290.data_._0_4_ = PFData::getNX(&local_268);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_288,"6","test_read.getNX()",(int *)&local_298,(int *)&local_290);
  if (local_288.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_298);
    if (local_280 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_280;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x282,pcVar5);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    if (local_298.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_298.data_ + 8))();
    }
  }
  puVar1 = local_280;
  if (local_280 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_280 != local_280 + 2) {
      operator_delete((undefined8 *)*local_280);
    }
    operator_delete(puVar1);
  }
  local_290.data_._0_4_ = 0;
  local_298.data_ = (AssertHelperData *)PFData::getZ(&local_268);
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&local_288,"0","test_read.getZ()",(int *)&local_290,(double *)&local_298);
  if (local_288.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_298);
    if (local_280 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_280;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x283,pcVar5);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    if (local_298.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_298.data_ + 8))();
    }
  }
  puVar1 = local_280;
  if (local_280 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_280 != local_280 + 2) {
      operator_delete((undefined8 *)*local_280);
    }
    operator_delete(puVar1);
  }
  local_290.data_._0_4_ = 0;
  local_298.data_ = (AssertHelperData *)PFData::getY(&local_268);
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&local_288,"0","test_read.getY()",(int *)&local_290,(double *)&local_298);
  if (local_288.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_298);
    if (local_280 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_280;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x284,pcVar5);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    if (local_298.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_298.data_ + 8))();
    }
  }
  puVar1 = local_280;
  if (local_280 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_280 != local_280 + 2) {
      operator_delete((undefined8 *)*local_280);
    }
    operator_delete(puVar1);
  }
  local_290.data_._0_4_ = 0;
  local_298.data_ = (AssertHelperData *)PFData::getX(&local_268);
  iVar3 = 0x14d701;
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&local_288,"0","test_read.getX()",(int *)&local_290,(double *)&local_298);
  if (local_288.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_298);
    if (local_280 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_280;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x285,pcVar5);
    iVar3 = (int)&local_298;
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    if (local_298.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_298.data_ + 8))();
    }
  }
  puVar1 = local_280;
  if (local_280 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_280 != local_280 + 2) {
      operator_delete((undefined8 *)*local_280);
    }
    operator_delete(puVar1);
  }
  PFData::close(&local_268,iVar3);
  PFData::close(&local_180,iVar3);
  local_298.data_ = local_298.data_ & 0xffffffff00000000;
  local_290.data_._0_4_ = remove("tests/pfb_file_from_data.pfb");
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_288,"0","remove(\"tests/pfb_file_from_data.pfb\")",(int *)&local_298
             ,(int *)&local_290);
  if (local_288.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_298);
    if (local_280 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_280;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x288,pcVar5);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_298);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    if (local_298.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_298.data_ + 8))();
    }
  }
  if (local_280 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_280 != local_280 + 2) {
      operator_delete((undefined8 *)*local_280);
    }
    operator_delete(local_280);
  }
  PFData::~PFData(&local_268);
  PFData::~PFData(&local_180);
  return;
}

Assistant:

TEST_F(PFData_test, fileFromData){
    int retval = -1;
    double data[24];
    for (int i =0; i<24; i++){
        data[i] = (double) rand() / 1000;
    }
    PFData test(data, 1, 4, 6);
    int r = test.getR();
    EXPECT_EQ(1, r);
    int q = test.getQ();
    EXPECT_EQ(1, q);
    int p = test.getP();
    EXPECT_EQ(1, p);
    retval = test.writeFile("tests/pfb_file_from_data.pfb");

    PFData test_read("tests/pfb_file_from_data.pfb");
    retval = test_read.loadHeader();
    EXPECT_EQ(0, retval);
    retval = test_read.loadData();
    EXPECT_EQ(0, retval);
    r = test_read.getR();
    EXPECT_EQ(1, r);
    q = test_read.getQ();
    EXPECT_EQ(1, q);
    p = test_read.getP();
    EXPECT_EQ(1, p);
    EXPECT_EQ(1, test_read.getDZ());
    EXPECT_EQ(1, test_read.getDY());
    EXPECT_EQ(1, test_read.getDX());
    EXPECT_EQ(1, test_read.getNZ());
    EXPECT_EQ(4, test_read.getNY());
    EXPECT_EQ(6, test_read.getNX());
    EXPECT_EQ(0, test_read.getZ());
    EXPECT_EQ(0, test_read.getY());
    EXPECT_EQ(0, test_read.getX());
    test_read.close();
    test.close();
    ASSERT_EQ(0,remove("tests/pfb_file_from_data.pfb"));
}